

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void jerry_rice(dw_rom *rom)

{
  undefined8 in_stack_fffffffffffffdd8;
  uint uVar1;
  undefined8 in_stack_fffffffffffffde0;
  undefined4 uVar2;
  undefined8 in_stack_fffffffffffffde8;
  uint uVar3;
  undefined8 in_stack_fffffffffffffdf0;
  undefined4 uVar4;
  undefined8 in_stack_fffffffffffffdf8;
  uint uVar5;
  undefined8 in_stack_fffffffffffffe00;
  undefined4 uVar6;
  undefined8 in_stack_fffffffffffffe08;
  undefined4 uVar7;
  undefined8 in_stack_fffffffffffffe10;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 uVar9;
  undefined8 in_stack_fffffffffffffe20;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffffe28;
  undefined4 uVar11;
  undefined8 in_stack_fffffffffffffe30;
  undefined4 uVar12;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 uVar13;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 uVar14;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 uVar15;
  undefined8 in_stack_fffffffffffffe50;
  undefined4 uVar16;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 uVar17;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 uVar18;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar19;
  undefined8 in_stack_fffffffffffffe70;
  undefined4 uVar20;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 uVar21;
  undefined8 in_stack_fffffffffffffe80;
  undefined4 uVar22;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 uVar23;
  undefined8 in_stack_fffffffffffffe90;
  undefined4 uVar24;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar25;
  undefined8 in_stack_fffffffffffffea0;
  undefined4 uVar26;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 uVar27;
  undefined8 in_stack_fffffffffffffeb0;
  undefined4 uVar28;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uVar29;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 uVar30;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 uVar31;
  undefined8 in_stack_fffffffffffffed0;
  undefined4 uVar32;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 uVar33;
  undefined8 in_stack_fffffffffffffee0;
  undefined4 uVar34;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar35;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 uVar36;
  undefined8 in_stack_fffffffffffffef8;
  undefined4 uVar37;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 uVar38;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar39;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 uVar40;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar41;
  undefined8 in_stack_ffffffffffffff20;
  undefined4 uVar42;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar43;
  undefined8 in_stack_ffffffffffffff30;
  undefined4 uVar44;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar45;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 uVar46;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar47;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 uVar48;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar49;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 uVar50;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar51;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 uVar52;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar53;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 uVar54;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar55;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uVar56;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar57;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar58;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar59;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 uVar60;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar61;
  
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  uVar1 = (uint)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  uVar3 = (uint)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  uVar5 = (uint)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  uVar15 = (undefined4)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  uVar16 = (undefined4)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  uVar19 = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  uVar20 = (undefined4)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  uVar21 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  uVar22 = (undefined4)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  uVar23 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  uVar24 = (undefined4)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  uVar25 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  uVar26 = (undefined4)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  uVar27 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  uVar28 = (undefined4)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  uVar29 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  uVar30 = (undefined4)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  uVar31 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  uVar32 = (undefined4)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  uVar33 = (undefined4)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  uVar34 = (undefined4)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  uVar35 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  uVar36 = (undefined4)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  uVar37 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  uVar38 = (undefined4)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  uVar39 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  uVar40 = (undefined4)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  uVar41 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  uVar42 = (undefined4)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  uVar43 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  uVar44 = (undefined4)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  uVar45 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  uVar46 = (undefined4)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  uVar47 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  uVar48 = (undefined4)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  uVar49 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  uVar50 = (undefined4)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uVar51 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  uVar52 = (undefined4)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  uVar53 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  uVar54 = (undefined4)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  uVar55 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar56 = (undefined4)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  uVar57 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar58 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  uVar59 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar60 = (undefined4)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  uVar61 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  no_equipment_sprites(rom);
  set_palette_colors(rom,'\0','\x06','8','%');
  set_palette_colors(rom,'\x01','\x06','1','\x0f');
  set_palette_colors(rom,'\x02','\x06','1','!');
  set_palette_colors(rom,'\x03','\x06',')','0');
  set_text(rom,0x80bd,"Head Coach");
  set_text(rom,0x8ab4,"Head Coach");
  set_text(rom,0x9001,"Head Coach");
  set_text(rom,0x9ebe,"Head Coach");
  set_text(rom,0xa480,"Coach");
  set_text(rom,0xba94,"Head Coach");
  set_text(rom,0x7b7d,"Randall");
  set_text(rom,0x9e9d,"Randall");
  set_text(rom,0xa46b,"Randall");
  set_text(rom,0xa536,"Randall");
  set_text(rom,0xa551,"Randall");
  set_text(rom,0xabae,"Randall");
  set_text(rom,0xb53f,"Randall");
  set_text(rom,0xb9dc,"Randall");
  set_text(rom,0x8fb6,"New Q.B. Randall");
  set_text(rom,0x9417,"New Q.B. Randall");
  set_text(rom,0x9e56,"New Q.B. Randall");
  set_text(rom,0x9f55,"New Q.B. Randall");
  set_text(rom,0xa499,"New Q.B. Randall");
  set_text(rom,0x9ee1,"New Q.B.");
  set_text(rom,0xa474,"New Q.B.");
  set_text(rom,0xa4fb,"New Q.B.");
  set_text(rom,0x9e83,"New Q.B.");
  set_text(rom,0xa00c,"New Q.B.");
  if ((rom->flags[0xe] & 8) != 0) {
    set_text(rom,0x7e56,anon_var_dwarf_98c);
    set_text(rom,0x8774,"JUKES");
  }
  vpatch(rom,0x1334,0x40,0x20,0,0x21,(ulong)uVar1 << 0x20,CONCAT44(uVar2,0x24),(ulong)uVar3 << 0x20,
         CONCAT44(uVar4,0x25),(ulong)uVar5 << 0x20,CONCAT44(uVar6,0x21),CONCAT44(uVar7,0x40),
         CONCAT44(uVar8,0x20),CONCAT44(uVar9,0x40),CONCAT44(uVar10,0x25),CONCAT44(uVar11,0x40),
         CONCAT44(uVar12,0x24),CONCAT44(uVar13,0x40),CONCAT44(uVar14,0x20),CONCAT44(uVar15,3),
         CONCAT44(uVar16,0x21),CONCAT44(uVar17,3),CONCAT44(uVar18,0x24),CONCAT44(uVar19,3),
         CONCAT44(uVar20,0x25),CONCAT44(uVar21,3),CONCAT44(uVar22,0x21),CONCAT44(uVar23,0x43),
         CONCAT44(uVar24,0x20),CONCAT44(uVar25,0x43),CONCAT44(uVar26,0x25),CONCAT44(uVar27,0x43),
         CONCAT44(uVar28,0x24),CONCAT44(uVar29,0x43),CONCAT44(uVar30,0x20),CONCAT44(uVar31,2),
         CONCAT44(uVar32,0x21),CONCAT44(uVar33,2),CONCAT44(uVar34,0x24),CONCAT44(uVar35,2),
         CONCAT44(uVar36,0x25),CONCAT44(uVar37,2),CONCAT44(uVar38,0x21),CONCAT44(uVar39,0x42),
         CONCAT44(uVar40,0x20),CONCAT44(uVar41,0x42),CONCAT44(uVar42,0x25),CONCAT44(uVar43,0x42),
         CONCAT44(uVar44,0x24),CONCAT44(uVar45,0x42),CONCAT44(uVar46,0x21),CONCAT44(uVar47,0x41),
         CONCAT44(uVar48,0x20),CONCAT44(uVar49,0x41),CONCAT44(uVar50,0x25),CONCAT44(uVar51,0x41),
         CONCAT44(uVar52,0x24),CONCAT44(uVar53,0x41),CONCAT44(uVar54,0x20),CONCAT44(uVar55,1),
         CONCAT44(uVar56,0x21),CONCAT44(uVar57,1),CONCAT44(uVar58,0x24),CONCAT44(uVar59,1),
         CONCAT44(uVar60,0x25),CONCAT44(uVar61,1));
  vpatch(rom,0x1384,0x20,0x21,0x42,0x20,0x42,0x25,0x42,0x24,0x42,0x20,2,0x21,2,0x24,2,0x25,2,0x20,0,
         0x21,0,0x24,0,0x25,0,0x21,0x40,0x20,0x40,0x25,0x40,0x24,0x40);
  vpatch(rom,0x13af,5,0x40,0x8f,0x42,0x8e,0x42);
  vpatch(rom,0x1404,0x10,0x21,0x43,0x20,0x43,0x25,0x43,0x24,0x43,0x20,3,0x21,3,0x24,3,0x25,3);
  vpatch(rom,0x142d,0x46,0,0x8d,2,0x8e,2,0x8f,2,0x26,0,0x27,0,0x28,0,0x29,0,0x30,0,0x31,0,0x32,0,
         0x33,0,0x26,3,0x27,3,0x28,3,0x29,3,0x30,3,0x31,3,0x32,3,0x33,3,0x26,2,0x27,2,0x28,2,0x29,2,
         0x30,2,0x31,2,0x32,2,0x33,2,0x26,1,0x27,1,0x28,1,0x29,1,0x30,1);
  vpatch(rom,0x1484,0x1f,0x30,2,0x31,2,0x32,2,0x33,2,0x26,2,0x27,2,0x28,2,0x29,2,0x30,0,0x31,0,0x32,
         0,0x33,0,0x26,0,0x27,0,0x28,0,0x29);
  vpatch(rom,0x14af,5,0x40,0x8f,0x42,0x8e,0x42);
  vpatch(rom,0x1504,0xf,0x26,3,0x27,3,0x28,3,0x29,3,0x30,3,0x31,3,0x32,3,0x33);
  vpatch(rom,0x1524,0x4f,0x27,0x42,0x26,0x42,0x29,0x42,0x28,0x42,0x8c,0,0x8d,2,0x8e,2,0x8f,2,0x34,0,
         0x35,0,0x36,0,0x37,0,0x35,0x40,0x34,0x40,0x37,0x40,0x36,0x40,0x35,0x43,0x34,0x43,0x37,0x43,
         0x36,0x43,0x34,3,0x35,3,0x36,3,0x37,3,0x34,2,0x35,2,0x36,2,0x37,2,0x35,0x42,0x34,0x42,0x37,
         0x42,0x36,0x42,0x34);
  vpatch(rom,0x1584,0x1f,0x34,2,0x35,2,0x36,2,0x37,2,0x35,0x42,0x34,0x42,0x37,0x42,0x36,0x42,0x34,0,
         0x35,0,0x36,0,0x37,0,0x35,0x40,0x34,0x40,0x37,0x40,0x36);
  vpatch(rom,0x15af,5,0x40,0x8f,0x42,0x8e,0x42);
  vpatch(rom,0x1604,0x10,0x35,0x43,0x34,0x43,0x37,0x43,0x36,0x43,0x34,3,0x35,3,0x36,3,0x37,3);
  vpatch(rom,0x162d,0x46,0,0x8d,2,0x8e,2,0x8f,2,0x27,0x40,0x26,0x40,0x29,0x40,0x28,0x40,0x31,0x40,
         0x30,0x40,0x33,0x40,0x32,0x40,0x27,0x43,0x26,0x43,0x29,0x43,0x28,0x43,0x31,0x43,0x30,0x43,
         0x33,0x43,0x32,0x43,0x27,0x42,0x26,0x42,0x29,0x42,0x28,0x42,0x31,0x42,0x30,0x42,0x33,0x42,
         0x32,0x42,0x27,0x41,0x26,0x41,0x29,0x41,0x28,0x41,0x31,0x41);
  vpatch(rom,0x1684,0x1f,0x27,0x42,0x26,0x42,0x29,0x42,0x28,0x42,0x31,0x42,0x30,0x42,0x33,0x42,0x32,
         0x42,0x27,0x40,0x26,0x40,0x29,0x40,0x28,0x40,0x31,0x40,0x30,0x40,0x33,0x40,0x32);
  vpatch(rom,0x16af,5,0x40,0x8f,0x42,0x8e,0x42);
  vpatch(rom,0x172d,5,0,0x8d,2,0x8e,2);
  vpatch(rom,0x11a90,0x40,0xf8,0xf1,1,0x1b,0x1b,0x1c,0xf,3,0xf8,0xf2,0xc6,7,0x47,0x53,0x50,0x1c,0xd8
         ,0xd8,0,0,0x20,0x2e,0,0,0xdf,0xdf,0xce,0xe,0x6e,0x60,0x6e,0xe,0x33,0x13,0,0xb0,0xbb,0x7b,
         0xf8,0xf8,0x37,0x97,199,0xc0,0xc3,0x83,0x1b,0x18,0xfb,0xb,0x60,0x70,0x77,0x67,0,0,0x1b,0xfb
         ,0xfb,0xf0,0xf7,7,0xef,0xe0);
  vpatch(rom,0x12200,0x20,0,1,1,1,0xf,0x1f,0x1f,0x1c,0,1,3,3,0xf,0x1f,0x1f,7,0,0,0x30,0x70,0xf8,0xe0
         ,0xf8,0xc,0,0x80,0xc0,0xc0,0xe0,0xf8,0xe0,0xe0);
  vpatch(rom,0x12240,0x5f,0x18,0x19,0,0,0,0,0,0,7,7,7,7,2,0,0,0,8,0,0,0,0,0xc0,0,0,0xe0,0xe0,0xe0,
         0xe0,0xe0,0xc0,0xc0,0xe0,0,0,0,1,7,3,1,1,0,0,0,1,1,1,1,3,0,0,0x10,0xd8,0xf8,0xfc,0xe8,0x10,
         0x30,0x78,0x60,0xe0,0xe0,0x80,0x90,0xe0,2);
  vpatch(rom,0x12300,0x80,0,0,0,3,7,6,1,1,0,0,0,3,1,1,2,2,0,0,0x20,0xb0,0xc0,0xf0,0xf0,0xf0,0x60,
         0xf0,0xc0,0xc0,0xb0,0xc0,0x40,0x40,2,1,0x10,0x10,0,0,0,0,7,7,0x7b,0x7e,0x4e,0,0,0,0,0x80,
         0x40,0x20,0,0x20,0,0,0xc0,0xe0,0xf0,0x70,0x30,0x20,0x30,0x38,0);
  vpatch(rom,0x12680,0x3f,0,0,2,0x13,0x7c,0x7f,0xff,0x32,6,0xf,0xc,0x1c,0x7b,0x5b,0xcf,0xc1,0,0,0,0,
         0,0,0,0,0,0,0,0,0,0,0,0,0xa1,0x89,0x5c,0x48,6,0x42,0x40,0,0xda,0xf0,0xe2,0x76,0x66,0x46,
         0x67,0xf0,0x80,0x80,0,0,0,0,0,0,0,0,0,0,0,0,0x80);
  vpatch(rom,0x12700,0x10);
  vpatch(rom,0x12720,0x10,0xe0,0xf0,0xf8,0xf8,0xf8,0xf8,0xf0,0xf0,0xe0,0xf0,0x78,0x18,0x58,0x58,0xb0
         ,0x6c);
  vpatch(rom,0x12740,0x10,0x40,0xe0,0xf0,0x7d,0,0,0x1f,0,0x3f,0x1f,0xf,0xf,0x3f,0x1f,0x1f,0x1f);
  vpatch(rom,0x12760,0x10,3,3,2,0xbc,0,0,0x78,0,0xfc,0xfc,0xfc,0xfc,0xfc,0xf8,0x78,0);
  vpatch(rom,0x12880,0x80,7,0xf,0x1f,0x1f,0x1f,0x1f,0xf,0xf,7,0xf,0x1e,0x18,0x1a,0x1a,1,0x32,0xe0,
         0xf0,0xf8,0xf8,0xf8,0xf8,0xf0,0xf0,0xe0,0xf0,0x78,0x18,0x58,0x58,0xb0,0x6c,0xc0,0xc0,0x40,
         0x3d,0,0,0x1e,0,0x3f,0x3f,0x3f,0x3f,0x3f,0x1f,0x1e,0,2,7,0xf,0xbe,0,0,0,0xf8,0xfc,0xf8,0xf0
         ,0xf0,0xfc,0xf8,0xf8,0xf8,0);
  vpatch(rom,0x12a20,0xde,0x18,0x19,0,0x18,0x18,0x18,0,0,7,7,7,7,2,0,0,0,8,0,0,0,0,0xc0,0,0,0xe0,
         0xe0,0xe0,0xe0,0xe0,0xc0,0xc0,0xe0,0,1,1,1,0xf,0x1f,0x1f,0x1c,0,1,3,3,0xf,0x1f,0x1f,7,0,0,
         0x18,0x3c,0xfc,0xf8,0xf8,0x38,0,0x80,0xc0,0xc0,0xf0,0xf8,0xf8,0xe0,0x10);
  vpatch(rom,0x12b20,0xe0);
  set_npc_palette(rom,NPC_KING,'\x01');
  set_npc_palette(rom,NPC_GIRL,'\x03');
  set_npc_palette(rom,NPC_DRAGONLORD,'\x01');
  return;
}

Assistant:

static void jerry_rice(dw_rom *rom)
{
    no_equipment_sprites(rom);
    set_palette_colors(rom, 0, 0x06, 0x38, 0x25);
    set_palette_colors(rom, 1, 0x06, 0x31, 0x0f);
    set_palette_colors(rom, 2, 0x06, 0x31, 0x21);
    set_palette_colors(rom, 3, 0x06, 0x29, 0x30);

    set_text(rom, 0x80bd, "Head Coach");
    set_text(rom, 0x8ab4, "Head Coach");
    set_text(rom, 0x9001, "Head Coach");
    set_text(rom, 0x9ebe, "Head Coach");
    set_text(rom, 0xa480, "Coach");
    set_text(rom, 0xba94, "Head Coach");
    set_text(rom, 0x7b7d, "Randall");
    set_text(rom, 0x9e9d, "Randall");
    set_text(rom, 0xa46b, "Randall");
    set_text(rom, 0xa536, "Randall");
    set_text(rom, 0xa551, "Randall");
    set_text(rom, 0xabae, "Randall");
    set_text(rom, 0xb53f, "Randall");
    set_text(rom, 0xb9dc, "Randall");
    set_text(rom, 0x8fb6, "New Q.B. Randall");
    set_text(rom, 0x9417, "New Q.B. Randall");
    set_text(rom, 0x9e56, "New Q.B. Randall");
    set_text(rom, 0x9f55, "New Q.B. Randall");
    set_text(rom, 0xa499, "New Q.B. Randall");
    set_text(rom, 0x9ee1, "New Q.B.");
    set_text(rom, 0xa474, "New Q.B.");
    set_text(rom, 0xa4fb, "New Q.B.");
    set_text(rom, 0x9e83, "New Q.B.");
    set_text(rom, 0xa00c, "New Q.B.");
    if (CUSTOM_SPELLS(rom)) {
        set_text(rom, 0x7e56, "REST\xff"
                              "BOMB\xff"
                              "SNEAK\xff"
                              "LIGHTS \xff"
                              "LEADBLOCK\xff"
                              "TIMEOUT\xff"
                              "HUDDLE\xff"
                              "JUKES\xff"
                              "GATORADE\xff"
                              "HAILMARY\xff");
        set_text(rom, 0x8774, "JUKES");
    }

    vpatch(rom, 0x01334,   64,  0x20,  0x00,  0x21,  0x00,  0x24,  0x00,  0x25,  0x00,  0x21,  0x40,  0x20,  0x40,  0x25,  0x40,  0x24,  0x40,  0x20,  0x03,  0x21,  0x03,  0x24,  0x03,  0x25,  0x03,  0x21,  0x43,  0x20,  0x43,  0x25,  0x43,  0x24,  0x43,  0x20,  0x02,  0x21,  0x02,  0x24,  0x02,  0x25,  0x02,  0x21,  0x42,  0x20,  0x42,  0x25,  0x42,  0x24,  0x42,  0x21,  0x41,  0x20,  0x41,  0x25,  0x41,  0x24,  0x41,  0x20,  0x01,  0x21,  0x01,  0x24,  0x01,  0x25,  0x01);
    vpatch(rom, 0x01384,   32,  0x21,  0x42,  0x20,  0x42,  0x25,  0x42,  0x24,  0x42,  0x20,  0x02,  0x21,  0x02,  0x24,  0x02,  0x25,  0x02,  0x20,  0x00,  0x21,  0x00,  0x24,  0x00,  0x25,  0x00,  0x21,  0x40,  0x20,  0x40,  0x25,  0x40,  0x24,  0x40);
    vpatch(rom, 0x013af,    5,  0x40,  0x8f,  0x42,  0x8e,  0x42);
    vpatch(rom, 0x01404,   16,  0x21,  0x43,  0x20,  0x43,  0x25,  0x43,  0x24,  0x43,  0x20,  0x03,  0x21,  0x03,  0x24,  0x03,  0x25,  0x03);
    vpatch(rom, 0x0142d,   70,  0x00,  0x8d,  0x02,  0x8e,  0x02,  0x8f,  0x02,  0x26,  0x00,  0x27,  0x00,  0x28,  0x00,  0x29,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x26,  0x03,  0x27,  0x03,  0x28,  0x03,  0x29,  0x03,  0x30,  0x03,  0x31,  0x03,  0x32,  0x03,  0x33,  0x03,  0x26,  0x02,  0x27,  0x02,  0x28,  0x02,  0x29,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x26,  0x01,  0x27,  0x01,  0x28,  0x01,  0x29,  0x01,  0x30,  0x01,  0x31,  0x01,  0x32,  0x01,  0x33);
    vpatch(rom, 0x01484,   31,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x26,  0x02,  0x27,  0x02,  0x28,  0x02,  0x29,  0x02,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x26,  0x00,  0x27,  0x00,  0x28,  0x00,  0x29);
    vpatch(rom, 0x014af,    5,  0x40,  0x8f,  0x42,  0x8e,  0x42);
    vpatch(rom, 0x01504,   15,  0x26,  0x03,  0x27,  0x03,  0x28,  0x03,  0x29,  0x03,  0x30,  0x03,  0x31,  0x03,  0x32,  0x03,  0x33);
    vpatch(rom, 0x01524,   79,  0x27,  0x42,  0x26,  0x42,  0x29,  0x42,  0x28,  0x42,  0x8c,  0x00,  0x8d,  0x02,  0x8e,  0x02,  0x8f,  0x02,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x35,  0x40,  0x34,  0x40,  0x37,  0x40,  0x36,  0x40,  0x35,  0x43,  0x34,  0x43,  0x37,  0x43,  0x36,  0x43,  0x34,  0x03,  0x35,  0x03,  0x36,  0x03,  0x37,  0x03,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x35,  0x42,  0x34,  0x42,  0x37,  0x42,  0x36,  0x42,  0x34,  0x01,  0x35,  0x01,  0x36,  0x01,  0x37,  0x01,  0x35,  0x41,  0x34,  0x41,  0x37,  0x41,  0x36);
    vpatch(rom, 0x01584,   31,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x35,  0x42,  0x34,  0x42,  0x37,  0x42,  0x36,  0x42,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x35,  0x40,  0x34,  0x40,  0x37,  0x40,  0x36);
    vpatch(rom, 0x015af,    5,  0x40,  0x8f,  0x42,  0x8e,  0x42);
    vpatch(rom, 0x01604,   16,  0x35,  0x43,  0x34,  0x43,  0x37,  0x43,  0x36,  0x43,  0x34,  0x03,  0x35,  0x03,  0x36,  0x03,  0x37,  0x03);
    vpatch(rom, 0x0162d,   70,  0x00,  0x8d,  0x02,  0x8e,  0x02,  0x8f,  0x02,  0x27,  0x40,  0x26,  0x40,  0x29,  0x40,  0x28,  0x40,  0x31,  0x40,  0x30,  0x40,  0x33,  0x40,  0x32,  0x40,  0x27,  0x43,  0x26,  0x43,  0x29,  0x43,  0x28,  0x43,  0x31,  0x43,  0x30,  0x43,  0x33,  0x43,  0x32,  0x43,  0x27,  0x42,  0x26,  0x42,  0x29,  0x42,  0x28,  0x42,  0x31,  0x42,  0x30,  0x42,  0x33,  0x42,  0x32,  0x42,  0x27,  0x41,  0x26,  0x41,  0x29,  0x41,  0x28,  0x41,  0x31,  0x41,  0x30,  0x41,  0x33,  0x41,  0x32);
    vpatch(rom, 0x01684,   31,  0x27,  0x42,  0x26,  0x42,  0x29,  0x42,  0x28,  0x42,  0x31,  0x42,  0x30,  0x42,  0x33,  0x42,  0x32,  0x42,  0x27,  0x40,  0x26,  0x40,  0x29,  0x40,  0x28,  0x40,  0x31,  0x40,  0x30,  0x40,  0x33,  0x40,  0x32);
    vpatch(rom, 0x016af,    5,  0x40,  0x8f,  0x42,  0x8e,  0x42);
    vpatch(rom, 0x0172d,    5,  0x00,  0x8d,  0x02,  0x8e,  0x02);
    vpatch(rom, 0x11a90,   64,  0xf8,  0xf1,  0x01,  0x1b,  0x1b,  0x1c,  0x0f,  0x03,  0xf8,  0xf2,  0xc6,  0x07,  0x47,  0x53,  0x50,  0x1c,  0xd8,  0xd8,  0x00,  0x00,  0x20,  0x2e,  0x00,  0x00,  0xdf,  0xdf,  0xce,  0x0e,  0x6e,  0x60,  0x6e,  0x0e,  0x33,  0x13,  0x00,  0xb0,  0xbb,  0x7b,  0xf8,  0xf8,  0x37,  0x97,  0xc7,  0xc0,  0xc3,  0x83,  0x1b,  0x18,  0xfb,  0x0b,  0x60,  0x70,  0x77,  0x67,  0x00,  0x00,  0x1b,  0xfb,  0xfb,  0xf0,  0xf7,  0x07,  0xef,  0xe0);
    vpatch(rom, 0x12200,   32,  0x00,  0x01,  0x01,  0x01,  0x0f,  0x1f,  0x1f,  0x1c,  0x00,  0x01,  0x03,  0x03,  0x0f,  0x1f,  0x1f,  0x07,  0x00,  0x00,  0x30,  0x70,  0xf8,  0xe0,  0xf8,  0x0c,  0x00,  0x80,  0xc0,  0xc0,  0xe0,  0xf8,  0xe0,  0xe0);
    vpatch(rom, 0x12240,   95,  0x18,  0x19,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x07,  0x07,  0x07,  0x07,  0x02,  0x00,  0x00,  0x00,  0x08,  0x00,  0x00,  0x00,  0x00,  0xc0,  0x00,  0x00,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xc0,  0xc0,  0xe0,  0x00,  0x00,  0x00,  0x01,  0x07,  0x03,  0x01,  0x01,  0x00,  0x00,  0x00,  0x01,  0x01,  0x01,  0x01,  0x03,  0x00,  0x00,  0x10,  0xd8,  0xf8,  0xfc,  0xe8,  0x10,  0x30,  0x78,  0x60,  0xe0,  0xe0,  0x80,  0x90,  0xe0,  0x02,  0x02,  0x04,  0x08,  0x18,  0x10,  0x00,  0x00,  0x07,  0x07,  0x0f,  0x0e,  0x1c,  0x30,  0x30,  0x18,  0x20,  0x00,  0x00,  0x20,  0x60,  0x00,  0x00,  0x00,  0xc0,  0xe0,  0x70,  0x30,  0x60,  0xc0,  0x60);
    vpatch(rom, 0x12300,  128,  0x00,  0x00,  0x00,  0x03,  0x07,  0x06,  0x01,  0x01,  0x00,  0x00,  0x00,  0x03,  0x01,  0x01,  0x02,  0x02,  0x00,  0x00,  0x20,  0xb0,  0xc0,  0xf0,  0xf0,  0xf0,  0x60,  0xf0,  0xc0,  0xc0,  0xb0,  0xc0,  0x40,  0x40,  0x02,  0x01,  0x10,  0x10,  0x00,  0x00,  0x00,  0x00,  0x07,  0x07,  0x7b,  0x7e,  0x4e,  0x00,  0x00,  0x00,  0x00,  0x80,  0x40,  0x20,  0x00,  0x20,  0x00,  0x00,  0xc0,  0xe0,  0xf0,  0x70,  0x30,  0x20,  0x30,  0x38,  0x00,  0x00,  0x00,  0x01,  0x05,  0x0c,  0x1f,  0x37,  0x00,  0x01,  0x03,  0x02,  0x06,  0x0f,  0x18,  0x08,  0x00,  0x80,  0xa0,  0xb0,  0xb8,  0x38,  0xe0,  0xf8,  0x00,  0x80,  0xe0,  0x70,  0x70,  0xf0,  0x78,  0xe0,  0x37,  0x37,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x08,  0x08,  0x07,  0x07,  0x06,  0x00,  0x00,  0x00,  0xf8,  0x80,  0x00,  0x00,  0x00,  0xc0,  0xc0,  0x00,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xc0,  0xe0,  0xe0);
    vpatch(rom, 0x12680,   63,  0x00,  0x00,  0x02,  0x13,  0x7c,  0x7f,  0xff,  0x32,  0x06,  0x0f,  0x0c,  0x1c,  0x7b,  0x5b,  0xcf,  0xc1,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xa1,  0x89,  0x5c,  0x48,  0x06,  0x42,  0x40,  0x00,  0xda,  0xf0,  0xe2,  0x76,  0x66,  0x46,  0x67,  0xf0,  0x80,  0x80,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80);
    vpatch(rom, 0x12700,   16,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x0f,  0x0f,  0x07,  0x0f,  0x1e,  0x18,  0x1a,  0x1a,  0x01,  0x32);
    vpatch(rom, 0x12720,   16,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf0,  0xf0,  0xe0,  0xf0,  0x78,  0x18,  0x58,  0x58,  0xb0,  0x6c);
    vpatch(rom, 0x12740,   16,  0x40,  0xe0,  0xf0,  0x7d,  0x00,  0x00,  0x1f,  0x00,  0x3f,  0x1f,  0x0f,  0x0f,  0x3f,  0x1f,  0x1f,  0x1f);
    vpatch(rom, 0x12760,   16,  0x03,  0x03,  0x02,  0xbc,  0x00,  0x00,  0x78,  0x00,  0xfc,  0xfc,  0xfc,  0xfc,  0xfc,  0xf8,  0x78,  0x00);
    vpatch(rom, 0x12880,  128,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x0f,  0x0f,  0x07,  0x0f,  0x1e,  0x18,  0x1a,  0x1a,  0x01,  0x32,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf0,  0xf0,  0xe0,  0xf0,  0x78,  0x18,  0x58,  0x58,  0xb0,  0x6c,  0xc0,  0xc0,  0x40,  0x3d,  0x00,  0x00,  0x1e,  0x00,  0x3f,  0x3f,  0x3f,  0x3f,  0x3f,  0x1f,  0x1e,  0x00,  0x02,  0x07,  0x0f,  0xbe,  0x00,  0x00,  0x00,  0xf8,  0xfc,  0xf8,  0xf0,  0xf0,  0xfc,  0xf8,  0xf8,  0xf8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x03,  0x03,  0x3c,  0x00,  0x00,  0x80,  0xc0,  0xff,  0xc0,  0xbc,  0x00,  0x00,  0x00,  0x40,  0xc8,  0x3e,  0xfe,  0x7f,  0x0c,  0x60,  0xf0,  0x30,  0x38,  0xde,  0xda,  0xf3,  0x03,  0x3c,  0x24,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x00,  0x05,  0x11,  0x3a,  0x12,  0x60,  0x42,  0x02,  0x00,  0x1b,  0x0f,  0x47,  0x6e,  0x66,  0x62,  0xe6,  0x0f);
    vpatch(rom, 0x12a20,  222,  0x18,  0x19,  0x00,  0x18,  0x18,  0x18,  0x00,  0x00,  0x07,  0x07,  0x07,  0x07,  0x02,  0x00,  0x00,  0x00,  0x08,  0x00,  0x00,  0x00,  0x00,  0xc0,  0x00,  0x00,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xc0,  0xc0,  0xe0,  0x00,  0x01,  0x01,  0x01,  0x0f,  0x1f,  0x1f,  0x1c,  0x00,  0x01,  0x03,  0x03,  0x0f,  0x1f,  0x1f,  0x07,  0x00,  0x00,  0x18,  0x3c,  0xfc,  0xf8,  0xf8,  0x38,  0x00,  0x80,  0xc0,  0xc0,  0xf0,  0xf8,  0xf8,  0xe0,  0x10,  0x00,  0x18,  0x18,  0x18,  0x03,  0x00,  0x00,  0x07,  0x07,  0x07,  0x07,  0x07,  0x03,  0x03,  0x07,  0x18,  0x98,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe0,  0xe0,  0xe0,  0xe0,  0x40,  0x00,  0x00,  0x00,  0x00,  0x00,  0x02,  0x1b,  0x1c,  0x1f,  0x1f,  0x1f,  0x06,  0x0f,  0x0c,  0x1c,  0x1b,  0x1c,  0x1c,  0x3c,  0x10,  0x10,  0x10,  0xff,  0xff,  0xff,  0xe7,  0xc3,  0x18,  0x3c,  0x3c,  0xff,  0xff,  0xff,  0x7e,  0x7e,  0x07,  0x11,  0x08,  0x04,  0x40,  0x00,  0x06,  0x00,  0x3e,  0x3c,  0x3e,  0xde,  0xfe,  0xb6,  0x06,  0x07,  0xe7,  0xff,  0x7f,  0x7e,  0x00,  0x00,  0x00,  0x00,  0x1e,  0x1e,  0x7e,  0x7e,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x02,  0x1b,  0x1c,  0x1f,  0x1f,  0x1f,  0x06,  0x0f,  0x0c,  0x1c,  0x1b,  0x1c,  0x1c,  0x3c,  0x00,  0x08,  0x08,  0x08,  0xff,  0xff,  0xff,  0xe7,  0x00,  0x18,  0x3c,  0x3c,  0xff,  0xff,  0xff,  0x7e,  0x08,  0x08,  0x10,  0x22,  0x63,  0x40,  0x00,  0x00,  0x3f,  0x3d,  0x39,  0x3b,  0x77,  0xc6,  0xc3,  0x60,  0xc3,  0xe7,  0xff,  0x7e,  0x7e,  0x00,  0x00,  0x00,  0x7e,  0x1e,  0x1e,  0x7e,  0x7e,  0x00);
    vpatch(rom, 0x12b20,  224,  0x7e,  0x7d,  0x3f,  0x0f,  0x03,  0x01,  0x01,  0x00,  0x67,  0x43,  0x00,  0x00,  0x03,  0x01,  0x01,  0x00,  0x00,  0x98,  0x48,  0x46,  0x0c,  0x60,  0x00,  0x00,  0xfc,  0xfe,  0xfc,  0xff,  0xef,  0xe0,  0x78,  0x00,  0x00,  0x0c,  0x12,  0x26,  0x26,  0x70,  0x6f,  0x1f,  0x00,  0x0e,  0x1f,  0x39,  0x39,  0x7f,  0x79,  0x3f,  0x00,  0x20,  0x28,  0x6c,  0x6e,  0x0e,  0xf8,  0xfe,  0x00,  0x60,  0xf8,  0x9c,  0x9c,  0xfc,  0x9e,  0xf8,  0xbf,  0x7e,  0x7d,  0x3f,  0x0f,  0x03,  0x01,  0x01,  0xf7,  0x67,  0x43,  0x00,  0x00,  0x03,  0x01,  0x01,  0x80,  0x50,  0x48,  0x48,  0x46,  0x0c,  0x60,  0x00,  0xfc,  0xfc,  0xfe,  0xfc,  0xff,  0xef,  0xe0,  0x78,  0x00,  0x0c,  0x12,  0x26,  0x26,  0x70,  0x6f,  0x5f,  0x00,  0x0e,  0x1f,  0x39,  0x39,  0x7f,  0x79,  0x7f,  0x00,  0x00,  0x40,  0xd8,  0x38,  0xf8,  0xf8,  0xf8,  0x60,  0xf0,  0x30,  0x38,  0xd8,  0x38,  0x38,  0x3c,  0x3f,  0x7e,  0x7d,  0x3f,  0x0f,  0x03,  0x01,  0x01,  0x77,  0x67,  0x43,  0x00,  0x00,  0x03,  0x01,  0x01,  0x80,  0x50,  0x48,  0x48,  0x46,  0x0c,  0x60,  0x00,  0xfc,  0xfc,  0xfe,  0xfc,  0xff,  0xef,  0xe0,  0x78,  0x0c,  0x12,  0x26,  0x26,  0x70,  0x6f,  0x5f,  0x3f,  0x0e,  0x1f,  0x39,  0x39,  0x7f,  0x79,  0x7f,  0x77,  0x00,  0x00,  0x40,  0xd8,  0x38,  0xf8,  0xf8,  0xf8,  0x60,  0xf0,  0x30,  0x38,  0xd8,  0x38,  0x38,  0x3c,  0x7e,  0x7d,  0x3f,  0x0f,  0x03,  0x01,  0x01,  0x00,  0x67,  0x43,  0x00,  0x00,  0x03,  0x01,  0x01,  0x00,  0x00,  0x98,  0x48,  0x46,  0x0c,  0x60,  0x00,  0x00,  0xfc,  0xfe,  0xfc,  0xff,  0xef,  0xe0,  0x78,  0x00);

    set_npc_palette(rom, NPC_KING, 1);
    set_npc_palette(rom, NPC_GIRL, 3);
    set_npc_palette(rom, NPC_DRAGONLORD, 1);
}